

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O1

size_t __thiscall rcg::Buffer::getDeliveredChunkPayloadSize(Buffer *this)

{
  GC_ERROR GVar1;
  void *pvVar2;
  unsigned_long ret;
  size_t size;
  INFO_DATATYPE type;
  size_t local_20 [2];
  INFO_DATATYPE local_c;
  
  pvVar2 = Stream::getHandle(this->parent);
  local_20[0] = 0;
  local_20[1] = 8;
  if (this->buffer != (BUFFER_HANDLE)0x0 && pvVar2 != (void *)0x0) {
    GVar1 = (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->DSGetBufferInfo)(pvVar2,this->buffer,0x17,&local_c,local_20,local_20 + 1);
    if (GVar1 != 0) {
      local_20[0] = 0;
    }
  }
  return local_20[0];
}

Assistant:

size_t Buffer::getDeliveredChunkPayloadSize() const
{
  return getBufferValue<size_t>(gentl, parent->getHandle(), buffer,
                                GenTL::BUFFER_INFO_DELIVERED_CHUNKPAYLOADSIZE);
}